

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

string * __thiscall
soul::SourceCodeOperations::ModuleDeclaration::getType_abi_cxx11_
          (string *__return_storage_ptr__,ModuleDeclaration *this)

{
  int iVar1;
  char *__s;
  allocator<char> local_11;
  
  iVar1 = (*(this->module->super_ASTObject)._vptr_ASTObject[6])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*(this->module->super_ASTObject)._vptr_ASTObject[5])();
    __s = "processor";
    if ((char)iVar1 != '\0') {
      __s = "graph";
    }
  }
  else {
    __s = "namespace";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeOperations::ModuleDeclaration::getType() const
{
    return module.isNamespace() ? "namespace"
                                : (module.isGraph() ? "graph" : "processor");
}